

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_verify.cpp
# Opt level: O1

void __thiscall embree::Scene::checkIfModifiedAndSet(Scene *this)

{
  _func_int **pp_Var1;
  byte bVar2;
  int iVar3;
  task *ptVar4;
  atomic_bool ret;
  small_object_allocator alloc;
  task_group_context context;
  byte local_151;
  task_traits local_150;
  undefined8 local_148;
  undefined4 local_140;
  wait_context local_138;
  task_group_context local_128;
  task_group_context local_a8;
  
  if (this[0x250] == (Scene)0x0) {
    pp_Var1 = *(_func_int ***)(this + 0x1d8);
    LOCK();
    local_151 = 0;
    UNLOCK();
    local_a8.my_version = proxy_support;
    local_a8.my_traits = (context_traits)0x4;
    local_a8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_a8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_a8.my_name = CUSTOM_CTX;
    tbb::detail::r1::initialize(&local_a8);
    local_128.my_version = proxy_support;
    local_128.my_traits = (context_traits)0x4;
    local_128.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_128.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_128.my_name = PARALLEL_FOR;
    tbb::detail::r1::initialize(&local_128);
    if (pp_Var1 != (_func_int **)0x0) {
      local_150.m_version_and_traits = 0;
      ptVar4 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_150,0xc0);
      ptVar4->m_reserved[3] = 0;
      ptVar4->m_reserved[4] = 0;
      ptVar4->m_reserved[1] = 0;
      ptVar4->m_reserved[2] = 0;
      (ptVar4->super_task_traits).m_version_and_traits = 0;
      ptVar4->m_reserved[0] = 0;
      ptVar4->m_reserved[5] = 0;
      ptVar4->_vptr_task = (_func_int **)&PTR__task_0026d9e8;
      ptVar4[1]._vptr_task = pp_Var1;
      ptVar4[1].super_task_traits.m_version_and_traits = 0;
      ptVar4[1].m_reserved[0] = 1;
      ptVar4[1].m_reserved[1] = (uint64_t)&local_151;
      ptVar4[1].m_reserved[2] = (uint64_t)this;
      ptVar4[1].m_reserved[3] = (uint64_t)&local_a8;
      iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar4[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar4[2]._vptr_task + 4) = 5;
      ptVar4[1].m_reserved[5] = ((long)iVar3 & 0x3fffffffffffffffU) * 2;
      ptVar4[2].super_task_traits.m_version_and_traits = local_150.m_version_and_traits;
      local_148 = 0;
      local_140 = 1;
      local_138.m_version_and_traits = 1;
      local_138.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar4[1].m_reserved[4] = (uint64_t)&local_148;
      tbb::detail::r1::execute_and_wait(ptVar4,&local_128,&local_138,&local_128);
    }
    tbb::detail::r1::destroy(&local_128);
    bVar2 = local_151;
    tbb::detail::r1::destroy(&local_a8);
    if ((bVar2 & 1) != 0) {
      this[0x250] = (Scene)0x1;
    }
  }
  return;
}

Assistant:

void Scene::checkIfModifiedAndSet ()
{
  if (isModified ()) return;

  auto geometryIsModified = [this](size_t geomID)->bool {
    return isGeometryModified(geomID);
  };

  if (parallel_any_of (size_t(0), geometries.size (), geometryIsModified)) {
    setModified ();
  }
}